

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseStack.c
# Opt level: O0

Parse_StackFn_t * Parse_StackFnStart(int nDepth)

{
  Parse_StackFn_t *__s;
  void **ppvVar1;
  Parse_StackFn_t *p;
  int nDepth_local;
  
  __s = (Parse_StackFn_t *)malloc(0x10);
  memset(__s,0,0x10);
  ppvVar1 = (void **)malloc((long)nDepth << 3);
  __s->pData = ppvVar1;
  __s->Size = nDepth;
  return __s;
}

Assistant:

Parse_StackFn_t * Parse_StackFnStart( int nDepth )
{
    Parse_StackFn_t * p;
    p = ABC_ALLOC( Parse_StackFn_t, 1 );
    memset( p, 0, sizeof(Parse_StackFn_t) );
    p->pData = ABC_ALLOC( void *, nDepth );
    p->Size = nDepth;
    return p;
}